

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamio.c
# Opt level: O0

void EncodeLatin0(uint c,StreamOut *out)

{
  StreamOut *out_local;
  uint c_local;
  
  if (c == 0x152) {
    out_local._4_4_ = 0xbc;
  }
  else if (c == 0x153) {
    out_local._4_4_ = 0xbd;
  }
  else if (c == 0x160) {
    out_local._4_4_ = 0xa6;
  }
  else if (c == 0x161) {
    out_local._4_4_ = 0xa8;
  }
  else if (c == 0x178) {
    out_local._4_4_ = 0xbe;
  }
  else if (c == 0x17d) {
    out_local._4_4_ = 0xb4;
  }
  else if (c == 0x17e) {
    out_local._4_4_ = 0xb8;
  }
  else {
    out_local._4_4_ = c;
    if (c == 0x20ac) {
      out_local._4_4_ = 0xa4;
    }
  }
  PutByte(out_local._4_4_,out);
  return;
}

Assistant:

static void EncodeLatin0( uint c, StreamOut* out )
{
    switch (c)
    {
    case 0x20AC: c = 0xA4; break;
    case 0x0160: c = 0xA6; break;
    case 0x0161: c = 0xA8; break;
    case 0x017D: c = 0xB4; break;
    case 0x017E: c = 0xB8; break;
    case 0x0152: c = 0xBC; break;
    case 0x0153: c = 0xBD; break;
    case 0x0178: c = 0xBE; break;
    }
    PutByte(c, out);
}